

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup.cpp
# Opt level: O0

void scm::setupEnvironment(Environment *env)

{
  undefined8 uVar1;
  string local_868;
  allocator<char> local_841;
  string local_840;
  string local_820;
  allocator<char> local_7f9;
  string local_7f8;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  string local_790;
  allocator<char> local_769;
  string local_768;
  string local_748;
  allocator<char> local_721;
  string local_720;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  string local_670;
  allocator<char> local_649;
  string local_648;
  string local_628;
  allocator<char> local_601;
  string local_600;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  string local_598;
  allocator<char> local_571;
  string local_570;
  string local_550;
  allocator<char> local_529;
  string local_528;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  string local_478;
  allocator<char> local_451;
  string local_450;
  string local_430;
  allocator<char> local_409;
  string local_408;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_61;
  string local_60;
  string local_30 [8];
  string helpText;
  Environment *env_local;
  
  helpText.field_2._8_8_ = env;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::operator=
            (local_30,
             "returns the first argument:\n  (quote 1 2 3) -> 1\n  (quote (1 2 3)) -> (1 2 3)\n  shorthand: \'(1 2 3)"
            );
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"quote",&local_61);
  std::__cxx11::string::string((string *)&local_88,local_30);
  defineNewSyntax((Environment *)uVar1,&local_60,-1,SYNTAX_QUOTE,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::operator=
            (local_30,
             "returns the first expression if the condition is true, the second otherwise:\n  (if #t 1 2) -> 1\n  (if #f 1 2) -> 2"
            );
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"if",&local_a9);
  std::__cxx11::string::string((string *)&local_d0,local_30);
  defineNewSyntax((Environment *)uVar1,&local_a8,-1,SYNTAX_IF,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::operator=
            (local_30,
             "defines a value to the given variable name\n  (define a 10) -> a := 10\n  can be used in shorthand form for lambda definition\n  (define (plus1 x) (+ x 1)"
            );
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"define",&local_f1);
  std::__cxx11::string::string((string *)&local_118,local_30);
  defineNewSyntax((Environment *)uVar1,&local_f0,-1,SYNTAX_DEFINE,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::operator=
            (local_30,
             "defines a value to the given variable name in all environments\n  (set! a 10) -> a := 10"
            );
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"set!",&local_139);
  std::__cxx11::string::string((string *)&local_160,local_30);
  defineNewSyntax((Environment *)uVar1,&local_138,-1,SYNTAX_SET,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::operator=
            (local_30,
             "defines a new function\n  (lambda (arg1 arg2) (+ arg1 arg2)\n  use in combination with define"
            );
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"lambda",&local_181);
  std::__cxx11::string::string((string *)&local_1a8,local_30);
  defineNewSyntax((Environment *)uVar1,&local_180,-1,SYNTAX_LAMBDA,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::operator=
            (local_30,
             "evaluate multiple expressions and return last result\n  (begin (+ 1 1) (+ 2 2)) -> 4")
  ;
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"begin",&local_1c9);
  std::__cxx11::string::string((string *)&local_1f0,local_30);
  defineNewSyntax((Environment *)uVar1,&local_1c8,-1,SYNTAX_BEGIN,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::__cxx11::string::operator=
            (local_30,
             "show help text for a given element\n  help -> shows all defined variables, functions and syntax elements\n  (help fname) -> shows a help text for the given function"
            );
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"help",&local_211);
  std::__cxx11::string::string((string *)&local_238,local_30);
  defineNewSyntax((Environment *)uVar1,&local_210,0,SYNTAX_HELP,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::__cxx11::string::operator=
            (local_30,
             "adds multiple numbers and/or strings\n  (+ 1 2 3) -> 6\n  (+ 1 2 2.5) -> 5.5\n  (+ \"hello \" \"world!\") -> \"hello world!\"\n  (+ \"hello \" 1 \" world!\") -> \"hello 1 world!\"\n  priority: string > float > integer"
            );
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"+",&local_259);
  std::__cxx11::string::string((string *)&local_280,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_258,-1,FUNC_ADD,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::operator=
            (local_30,
             "subtracts the sum of multiple numbers from the first argument\n  (- 1 2 3) -> 4\n  (- 1 2 2.5) -> 3.5"
            );
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"-",&local_2a1);
  std::__cxx11::string::string((string *)&local_2c8,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_2a0,-1,FUNC_SUB,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::__cxx11::string::operator=
            (local_30,"multiplies all arguments with each other\n  (* 2 2 2) -> 8");
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"*",&local_2e9);
  std::__cxx11::string::string((string *)&local_310,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_2e8,-1,FUNC_MULT,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::operator=
            (local_30,
             "divides the first argument by the product of all other arguments\n  (/ 2 2 2) -> 0.5")
  ;
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"/",&local_331);
  std::__cxx11::string::string((string *)&local_358,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_330,-1,FUNC_DIV,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::__cxx11::string::operator=
            (local_30,"returns true if same exact object\n  (eq? 1 1) -> #f\n  (eq? a a) -> #t");
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"eq?",&local_379);
  std::__cxx11::string::string((string *)&local_3a0,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_378,2,FUNC_EQ,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::__cxx11::string::operator=
            (local_30,
             "returns true if the passed strings are identical\n  (equal-string? \"asd\" \"asd\") -> #t\n  (equal-string? \"asd\" \"qwe\") -> #f"
            );
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"equal-string?",&local_3c1);
  std::__cxx11::string::string((string *)&local_3e8,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_3c0,2,FUNC_EQUAL_STRING,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::operator=
            (local_30,
             "returns true if the passed numbers are equal\n  (= 1 1) -> #t\n  (= 1 2) -> #f\n  (= 1 1.0) -> #t"
            );
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"=",&local_409);
  std::__cxx11::string::string((string *)&local_430,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_408,2,FUNC_EQUAL_NUMBER,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::__cxx11::string::operator=
            (local_30,
             "returns true if the first numbers is greater than the latter\n  (> 1 1) -> #f\n  (> 3 2) -> #t\n  (> 0 1.0) -> #f"
            );
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,">",&local_451);
  std::__cxx11::string::string((string *)&local_478,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_450,2,FUNC_GT,&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::__cxx11::string::operator=
            (local_30,
             "returns true if the first numbers is lesser than the latter\n  (< 1 1) -> #f\n  (< 3 2) -> #f\n  (< 0 1.0) -> #t"
            );
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"<",&local_499);
  std::__cxx11::string::string((string *)&local_4c0,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_498,2,FUNC_LT,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::__cxx11::string::operator=
            (local_30,
             "assembles a new cons object\n  (cons 1 2) -> (1 . 2)\n  (cons 1 \'(2 3)) -> (1 2 3)");
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"cons",&local_4e1);
  std::__cxx11::string::string((string *)&local_508,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_4e0,2,FUNC_CONS,&local_508);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::__cxx11::string::operator=(local_30,"get the car of a cons\n  (car \'(1 2 3)) -> 1");
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"car",&local_529);
  std::__cxx11::string::string((string *)&local_550,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_528,1,FUNC_CAR,&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::__cxx11::string::operator=(local_30,"get the cdr of a cons\n  (cdr \'(1 2 3)) -> (2 3)");
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"cdr",&local_571);
  std::__cxx11::string::string((string *)&local_598,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_570,1,FUNC_CDR,&local_598);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::__cxx11::string::operator=
            (local_30,"assembles a list with the given arguments\n  (list 1 2 3) -> (1 2 3)");
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"list",&local_5b9);
  std::__cxx11::string::string((string *)&local_5e0,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_5b8,-1,FUNC_LIST,&local_5e0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::__cxx11::string::operator=
            (local_30,
             "displays the passed argument, best used within functions\n  (display 1 2 3) -> returns void, prints (1 2 3)"
            );
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"display",&local_601);
  std::__cxx11::string::string((string *)&local_628,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_600,-1,FUNC_DISPLAY,&local_628);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  std::__cxx11::string::operator=(local_30,"returns the function body of a given lambda");
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"function-body",&local_649);
  std::__cxx11::string::string((string *)&local_670,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_648,1,FUNC_FUNCTION_BODY,&local_670);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::__cxx11::string::operator=(local_30,"returns the function argument list of a given lambda");
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"function-arglist",&local_691);
  std::__cxx11::string::string((string *)&local_6b8,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_690,1,FUNC_FUNCTION_ARGLIST,&local_6b8);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::__cxx11::string::operator=(local_30,"returns true if the argument is a string");
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"string?",&local_6d9);
  std::__cxx11::string::string((string *)&local_700,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_6d8,1,FUNC_IS_STRING,&local_700);
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::__cxx11::string::operator=
            (local_30,"returns true if the argument is an integer or a float value");
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"number?",&local_721);
  std::__cxx11::string::string((string *)&local_748,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_720,1,FUNC_IS_NUMBER,&local_748);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  std::__cxx11::string::operator=(local_30,"returns true if the argument is a cons object");
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"cons?",&local_769);
  std::__cxx11::string::string((string *)&local_790,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_768,1,FUNC_IS_CONS,&local_790);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  std::__cxx11::string::operator=(local_30,"returns true if the argument is a builtin function");
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b0,"function?",&local_7b1);
  std::__cxx11::string::string((string *)&local_7d8,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_7b0,1,FUNC_IS_FUNC,&local_7d8);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  std::__cxx11::string::operator=
            (local_30,"returns true if the argument is a user defined function");
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f8,"user-function?",&local_7f9);
  std::__cxx11::string::string((string *)&local_820,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_7f8,1,FUNC_IS_USERFUNC,&local_820);
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::__cxx11::string::operator=(local_30,"returns true if the argument is real bool value");
  uVar1 = helpText.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"bool?",&local_841);
  std::__cxx11::string::string((string *)&local_868,local_30);
  defineNewBuiltinFunction((Environment *)uVar1,&local_840,1,FUNC_IS_BOOL,&local_868);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator(&local_841);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void setupEnvironment(Environment& env)
{
  std::string helpText{};
  // setup syntax
  helpText =
      "returns the first argument:\n\
  (quote 1 2 3) -> 1\n\
  (quote (1 2 3)) -> (1 2 3)\n\
  shorthand: '(1 2 3)";
  defineNewSyntax(env, "quote", -1, SYNTAX_QUOTE, helpText);
  helpText =
      "returns the first expression if the condition is true, the second otherwise:\n\
  (if #t 1 2) -> 1\n\
  (if #f 1 2) -> 2";
  defineNewSyntax(env, "if", -1, SYNTAX_IF, helpText);
  helpText =
      "defines a value to the given variable name\n\
  (define a 10) -> a := 10\n\
  can be used in shorthand form for lambda definition\n\
  (define (plus1 x) (+ x 1)";
  defineNewSyntax(env, "define", -1, SYNTAX_DEFINE, helpText);
  helpText =
      "defines a value to the given variable name in all environments\n\
  (set! a 10) -> a := 10";
  defineNewSyntax(env, "set!", -1, SYNTAX_SET, helpText);
  helpText =
      "defines a new function\n\
  (lambda (arg1 arg2) (+ arg1 arg2)\n\
  use in combination with define";
  defineNewSyntax(env, "lambda", -1, SYNTAX_LAMBDA, helpText);
  helpText =
      "evaluate multiple expressions and return last result\n\
  (begin (+ 1 1) (+ 2 2)) -> 4";
  defineNewSyntax(env, "begin", -1, SYNTAX_BEGIN, helpText);
  helpText =
      "show help text for a given element\n\
  help -> shows all defined variables, functions and syntax elements\n\
  (help fname) -> shows a help text for the given function";
  defineNewSyntax(env, "help", 0, SYNTAX_HELP, helpText);

  // setup builtin functions
  helpText =
      "adds multiple numbers and/or strings\n\
  (+ 1 2 3) -> 6\n\
  (+ 1 2 2.5) -> 5.5\n\
  (+ \"hello \" \"world!\") -> \"hello world!\"\n\
  (+ \"hello \" 1 \" world!\") -> \"hello 1 world!\"\n\
  priority: string > float > integer";
  defineNewBuiltinFunction(env, "+", -1, FUNC_ADD, helpText);
  helpText =
      "subtracts the sum of multiple numbers from the first argument\n\
  (- 1 2 3) -> 4\n\
  (- 1 2 2.5) -> 3.5";
  defineNewBuiltinFunction(env, "-", -1, FUNC_SUB, helpText);
  helpText =
      "multiplies all arguments with each other\n\
  (* 2 2 2) -> 8";
  defineNewBuiltinFunction(env, "*", -1, FUNC_MULT, helpText);
  helpText =
      "divides the first argument by the product of all other arguments\n\
  (/ 2 2 2) -> 0.5";
  defineNewBuiltinFunction(env, "/", -1, FUNC_DIV, helpText);
  helpText =
      "returns true if same exact object\n\
  (eq? 1 1) -> #f\n\
  (eq? a a) -> #t";
  defineNewBuiltinFunction(env, "eq?", 2, FUNC_EQ, helpText);
  helpText =
      "returns true if the passed strings are identical\n\
  (equal-string? \"asd\" \"asd\") -> #t\n\
  (equal-string? \"asd\" \"qwe\") -> #f";
  defineNewBuiltinFunction(env, "equal-string?", 2, FUNC_EQUAL_STRING, helpText);
  helpText =
      "returns true if the passed numbers are equal\n\
  (= 1 1) -> #t\n\
  (= 1 2) -> #f\n\
  (= 1 1.0) -> #t";
  defineNewBuiltinFunction(env, "=", 2, FUNC_EQUAL_NUMBER, helpText);
  helpText =
      "returns true if the first numbers is greater than the latter\n\
  (> 1 1) -> #f\n\
  (> 3 2) -> #t\n\
  (> 0 1.0) -> #f";
  defineNewBuiltinFunction(env, ">", 2, FUNC_GT, helpText);
  helpText =
      "returns true if the first numbers is lesser than the latter\n\
  (< 1 1) -> #f\n\
  (< 3 2) -> #f\n\
  (< 0 1.0) -> #t";
  defineNewBuiltinFunction(env, "<", 2, FUNC_LT, helpText);
  helpText =
      "assembles a new cons object\n\
  (cons 1 2) -> (1 . 2)\n\
  (cons 1 '(2 3)) -> (1 2 3)";
  defineNewBuiltinFunction(env, "cons", 2, FUNC_CONS, helpText);
  helpText =
      "get the car of a cons\n\
  (car '(1 2 3)) -> 1";
  defineNewBuiltinFunction(env, "car", 1, FUNC_CAR, helpText);
  helpText =
      "get the cdr of a cons\n\
  (cdr '(1 2 3)) -> (2 3)";
  defineNewBuiltinFunction(env, "cdr", 1, FUNC_CDR, helpText);
  helpText =
      "assembles a list with the given arguments\n\
  (list 1 2 3) -> (1 2 3)";
  defineNewBuiltinFunction(env, "list", -1, FUNC_LIST, helpText);
  helpText =
      "displays the passed argument, best used within functions\n\
  (display 1 2 3) -> returns void, prints (1 2 3)";
  defineNewBuiltinFunction(env, "display", -1, FUNC_DISPLAY, helpText);
  helpText = "returns the function body of a given lambda";
  defineNewBuiltinFunction(env, "function-body", 1, FUNC_FUNCTION_BODY, helpText);
  helpText = "returns the function argument list of a given lambda";
  defineNewBuiltinFunction(env, "function-arglist", 1, FUNC_FUNCTION_ARGLIST, helpText);
  helpText = "returns true if the argument is a string";
  defineNewBuiltinFunction(env, "string?", 1, FUNC_IS_STRING, helpText);
  helpText = "returns true if the argument is an integer or a float value";
  defineNewBuiltinFunction(env, "number?", 1, FUNC_IS_NUMBER, helpText);
  helpText = "returns true if the argument is a cons object";
  defineNewBuiltinFunction(env, "cons?", 1, FUNC_IS_CONS, helpText);
  helpText = "returns true if the argument is a builtin function";
  defineNewBuiltinFunction(env, "function?", 1, FUNC_IS_FUNC, helpText);
  helpText = "returns true if the argument is a user defined function";
  defineNewBuiltinFunction(env, "user-function?", 1, FUNC_IS_USERFUNC, helpText);
  helpText = "returns true if the argument is real bool value";
  defineNewBuiltinFunction(env, "bool?", 1, FUNC_IS_BOOL, helpText);
}